

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::DirectStateAccess::Framebuffers::ClearNamedFramebufferErrorsTest::iterate
          (ClearNamedFramebufferErrorsTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  int iVar14;
  ContextType ctxType;
  undefined4 extraout_var;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  GLfloat fcolor [4];
  GLint icolor [4];
  GLuint ucolor [4];
  long lVar15;
  
  iVar14 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar15 = CONCAT44(extraout_var,iVar14);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar1) || (bVar2)) {
    PrepareObjects(this);
    icolor[0] = 0;
    icolor[1] = 0;
    icolor[2] = 0;
    icolor[3] = 0;
    ucolor[0] = 0;
    ucolor[1] = 0;
    ucolor[2] = 0;
    ucolor[3] = 0;
    fcolor[0] = 0.0;
    fcolor[1] = 0.0;
    fcolor[2] = 0.0;
    fcolor[3] = 0.0;
    (**(code **)(lVar15 + 0x1f8))(this->m_fbo_invalid,0x1800,0);
    bVar1 = ExpectError(this,0x502,"ClearNamedFramebufferiv",
                        "framebuffer is not zero or the name of an existing framebuffer object.");
    (**(code **)(lVar15 + 0x200))(this->m_fbo_invalid,0x1800,0,ucolor);
    bVar2 = ExpectError(this,0x502,"ClearNamedFramebufferuiv",
                        "framebuffer is not zero or the name of an existing framebuffer object.");
    (**(code **)(lVar15 + 0x1f0))(this->m_fbo_invalid,0x1800,0,fcolor);
    bVar3 = ExpectError(this,0x502,"ClearNamedFramebufferfv",
                        "framebuffer is not zero or the name of an existing framebuffer object.");
    (**(code **)(lVar15 + 0x1e8))(fcolor[0],this->m_fbo_invalid,0x84f9,0,icolor._0_8_ & 0xffffffff);
    bVar4 = ExpectError(this,0x502,"ClearNamedFramebufferfi",
                        "framebuffer is not zero or the name of an existing framebuffer object.");
    (**(code **)(lVar15 + 0x1f8))(this->m_fbo_valid,0x1801,0,icolor);
    bVar5 = ExpectError(this,0x500,"ClearNamedFramebufferiv",
                        "buffer is not COLOR or STENCIL (it is DEPTH).");
    (**(code **)(lVar15 + 0x200))(this->m_fbo_valid,0x1801,0,ucolor);
    bVar6 = ExpectError(this,0x500,"ClearNamedFramebufferuiv","buffer is not COLOR (it is DEPTH).");
    (**(code **)(lVar15 + 0x1f0))(this->m_fbo_valid,0x1802,0,fcolor);
    bVar7 = ExpectError(this,0x500,"ClearNamedFramebufferfv",
                        "buffer is not COLOR or DEPTH (it is STENCIL).");
    (**(code **)(lVar15 + 0x1e8))(fcolor[0],this->m_fbo_valid,0x1800,0,icolor._0_8_ & 0xffffffff);
    bVar8 = ExpectError(this,0x500,"ClearNamedFramebufferfi","buffer is not DEPTH_STENCIL.");
    (**(code **)(lVar15 + 0x1f8))(this->m_fbo_valid,0x1800,0xffffffffffffffff,icolor);
    bVar9 = ExpectError(this,0x501,"ClearNamedFramebufferiv",
                        "buffer is COLOR drawbuffer is negative, or greater than the value of MAX_DRAW_BUFFERS minus one."
                       );
    (**(code **)(lVar15 + 0x200))(this->m_fbo_valid,0x1800,0xffffffffffffffff,ucolor);
    bVar10 = ExpectError(this,0x501,"ClearNamedFramebufferuiv",
                         "buffer is COLOR drawbuffer is negative, or greater than the value of MAX_DRAW_BUFFERS minus one."
                        );
    (**(code **)(lVar15 + 0x1f8))(this->m_fbo_valid,0x1802,1,icolor);
    bVar11 = ExpectError(this,0x501,"ClearNamedFramebufferiv",
                         "buffer is DEPTH, STENCIL or DEPTH_STENCIL and drawbuffer is not zero.");
    (**(code **)(lVar15 + 0x1f0))(this->m_fbo_valid,0x1801,1,fcolor);
    bVar12 = ExpectError(this,0x501,"ClearNamedFramebufferfv",
                         "buffer is DEPTH, STENCIL or DEPTH_STENCIL and drawbuffer is not zero.");
    (**(code **)(lVar15 + 0x1e8))(fcolor[0],this->m_fbo_valid,0x84f9,1,icolor._0_8_ & 0xffffffff);
    bVar13 = ExpectError(this,0x501,"ClearNamedFramebufferfi",
                         "buffer is DEPTH, STENCIL or DEPTH_STENCIL and drawbuffer is not zero.");
    Clean(this);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if ((((((((((((bVar1 && bVar2) && bVar3) && bVar4) && bVar5) && bVar6) && bVar7) && bVar8) &&
           bVar9) && bVar10) && bVar11) && bVar12) && bVar13) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult ClearNamedFramebufferErrorsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	try
	{
		/* Prepare objects. */
		PrepareObjects();

		glw::GLint   icolor[4] = {};
		glw::GLuint  ucolor[4] = {};
		glw::GLfloat fcolor[4] = {};

		/*  Check that INVALID_OPERATION is generated by ClearNamedFramebuffer* if
		 framebuffer is not zero or the name of an existing framebuffer object. */
		gl.clearNamedFramebufferiv(m_fbo_invalid, GL_COLOR, 0, icolor);

		is_ok &= ExpectError(GL_INVALID_OPERATION, "ClearNamedFramebufferiv",
							 "framebuffer is not zero or the name of an existing framebuffer object.");

		gl.clearNamedFramebufferuiv(m_fbo_invalid, GL_COLOR, 0, ucolor);

		is_ok &= ExpectError(GL_INVALID_OPERATION, "ClearNamedFramebufferuiv",
							 "framebuffer is not zero or the name of an existing framebuffer object.");

		gl.clearNamedFramebufferfv(m_fbo_invalid, GL_COLOR, 0, fcolor);

		is_ok &= ExpectError(GL_INVALID_OPERATION, "ClearNamedFramebufferfv",
							 "framebuffer is not zero or the name of an existing framebuffer object.");

		gl.clearNamedFramebufferfi(m_fbo_invalid, GL_DEPTH_STENCIL, 0, fcolor[0], icolor[0]);

		is_ok &= ExpectError(GL_INVALID_OPERATION, "ClearNamedFramebufferfi",
							 "framebuffer is not zero or the name of an existing framebuffer object.");

		/*  Check that INVALID_ENUM is generated by ClearNamedFramebufferiv if buffer
		 is not COLOR or STENCIL. */
		gl.clearNamedFramebufferiv(m_fbo_valid, GL_DEPTH, 0, icolor);

		is_ok &=
			ExpectError(GL_INVALID_ENUM, "ClearNamedFramebufferiv", "buffer is not COLOR or STENCIL (it is DEPTH).");

		/*  Check that INVALID_ENUM is generated by ClearNamedFramebufferuiv if buffer
		 is not COLOR. */
		gl.clearNamedFramebufferuiv(m_fbo_valid, GL_DEPTH, 0, ucolor);

		is_ok &= ExpectError(GL_INVALID_ENUM, "ClearNamedFramebufferuiv", "buffer is not COLOR (it is DEPTH).");

		/*  Check that INVALID_ENUM is generated by ClearNamedFramebufferfv buffer
		 is not COLOR or DEPTH. */
		gl.clearNamedFramebufferfv(m_fbo_valid, GL_STENCIL, 0, fcolor);

		is_ok &=
			ExpectError(GL_INVALID_ENUM, "ClearNamedFramebufferfv", "buffer is not COLOR or DEPTH (it is STENCIL).");

		/*  Check that INVALID_ENUM is generated by ClearNamedFramebufferfi if buffer
		 is not DEPTH_STENCIL. */
		gl.clearNamedFramebufferfi(m_fbo_valid, GL_COLOR, 0, fcolor[0], icolor[0]);

		is_ok &= ExpectError(GL_INVALID_ENUM, "ClearNamedFramebufferfi", "buffer is not DEPTH_STENCIL.");

		/*  Check that INVALID_VALUE is generated by ClearNamedFramebuffer* if buffer is COLOR drawbuffer is
		 negative, or greater than the value of MAX_DRAW_BUFFERS minus one. */
		gl.clearNamedFramebufferiv(m_fbo_valid, GL_COLOR, -1, icolor);

		is_ok &= ExpectError(
			GL_INVALID_VALUE, "ClearNamedFramebufferiv",
			"buffer is COLOR drawbuffer is negative, or greater than the value of MAX_DRAW_BUFFERS minus one.");

		gl.clearNamedFramebufferuiv(m_fbo_valid, GL_COLOR, -1, ucolor);

		is_ok &= ExpectError(
			GL_INVALID_VALUE, "ClearNamedFramebufferuiv",
			"buffer is COLOR drawbuffer is negative, or greater than the value of MAX_DRAW_BUFFERS minus one.");

		/*  Check that INVALID_VALUE is generated by ClearNamedFramebuffer* if buffer is DEPTH, STENCIL or
		 DEPTH_STENCIL and drawbuffer is not zero. */

		gl.clearNamedFramebufferiv(m_fbo_valid, GL_STENCIL, 1, icolor);

		is_ok &= ExpectError(GL_INVALID_VALUE, "ClearNamedFramebufferiv",
							 "buffer is DEPTH, STENCIL or DEPTH_STENCIL and drawbuffer is not zero.");

		gl.clearNamedFramebufferfv(m_fbo_valid, GL_DEPTH, 1, fcolor);

		is_ok &= ExpectError(GL_INVALID_VALUE, "ClearNamedFramebufferfv",
							 "buffer is DEPTH, STENCIL or DEPTH_STENCIL and drawbuffer is not zero.");

		gl.clearNamedFramebufferfi(m_fbo_valid, GL_DEPTH_STENCIL, 1, fcolor[0], icolor[0]);

		is_ok &= ExpectError(GL_INVALID_VALUE, "ClearNamedFramebufferfi",
							 "buffer is DEPTH, STENCIL or DEPTH_STENCIL and drawbuffer is not zero.");
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	Clean();

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}